

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_b6a8b::readWriteTest(string *tempDir,int channelCount,int testTimes)

{
  ostream *poVar1;
  void *pvVar2;
  char *pcVar3;
  int in_EDX;
  int in_ESI;
  Compression compression;
  int compressionIndex;
  int i;
  string filename;
  undefined1 in_stack_000006e7;
  Compression in_stack_000006e8;
  int in_stack_000006ec;
  string *in_stack_000006f0;
  undefined1 in_stack_0000075a;
  undefined1 in_stack_0000075b;
  int in_stack_0000075c;
  string *in_stack_00000760;
  string local_90 [16];
  char *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_60 [36];
  undefined4 local_3c;
  int local_38;
  int local_34;
  string local_30 [32];
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing files with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  poVar1 = std::operator<<(poVar1," channels ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," times.");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  for (local_34 = 0; local_34 < local_10; local_34 = local_34 + 1) {
    local_38 = local_34 % 3;
    if (local_38 == 0) {
      local_3c = 0;
    }
    else if (local_38 == 1) {
      local_3c = 1;
    }
    else if (local_38 == 2) {
      local_3c = 2;
    }
    std::__cxx11::string::string(local_60,local_30);
    generateRandomFile(in_stack_000006f0,in_stack_000006ec,in_stack_000006e8,(bool)in_stack_000006e7
                      );
    std::__cxx11::string::~string(local_60);
    readFile(in_stack_00000760,in_stack_0000075c,(bool)in_stack_0000075b,(bool)in_stack_0000075a);
    if (1 < local_c) {
      readFile(in_stack_00000760,in_stack_0000075c,(bool)in_stack_0000075b,(bool)in_stack_0000075a);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_90,local_30);
    generateRandomFile(in_stack_000006f0,in_stack_000006ec,in_stack_000006e8,(bool)in_stack_000006e7
                      );
    std::__cxx11::string::~string(local_90);
    readFile(in_stack_00000760,in_stack_0000075c,(bool)in_stack_0000075b,(bool)in_stack_0000075a);
    if (1 < local_c) {
      readFile(in_stack_00000760,in_stack_0000075c,(bool)in_stack_0000075b,(bool)in_stack_0000075a);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void readWriteTest(const std::string & tempDir, int channelCount, int testTimes)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes << " times."
         << endl << flush;

    std::string filename = tempDir + "imf_test_deep_scanline_basic.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0:
                compression = NO_COMPRESSION;
                break;
            case 1:
                compression = RLE_COMPRESSION;
                break;
            case 2:
                compression = ZIPS_COMPRESSION;
                break;
        }

        generateRandomFile (filename, channelCount, compression, false);
        readFile (filename, channelCount, false , false );
	if (channelCount>1)
	    readFile (filename, channelCount, false , true );
        remove (filename.c_str());
        cout << endl << flush;

        generateRandomFile (filename, channelCount, compression, true);
        readFile (filename, channelCount, true , false );
	if (channelCount>1)
	    readFile (filename, channelCount, true , true );
        remove (filename.c_str());
        cout << endl << flush;
    }
}